

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O1

char * bufread_simple_label(shared_data *sd,label_data *ld,char *c)

{
  float fVar1;
  float fVar2;
  
  ld->label = *(float *)c;
  ld->weight = *(float *)(c + 4);
  ld->initial = *(float *)(c + 8);
  fVar1 = ld->label;
  if (((fVar1 != 3.4028235e+38) || (NAN(fVar1))) && (sd->is_more_than_two_labels_observed == false))
  {
    fVar2 = sd->first_observed_label;
    if ((fVar2 != 3.4028235e+38) || (NAN(fVar2))) {
      if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
        fVar2 = sd->second_observed_label;
        if ((fVar2 != 3.4028235e+38) || (NAN(fVar2))) {
          if ((fVar2 != fVar1) || (NAN(fVar2) || NAN(fVar1))) {
            sd->is_more_than_two_labels_observed = true;
          }
        }
        else {
          sd->second_observed_label = fVar1;
        }
      }
    }
    else {
      sd->first_observed_label = fVar1;
    }
  }
  return c + 0xc;
}

Assistant:

char* bufread_simple_label(shared_data* sd, label_data* ld, char* c)
{
  memcpy(&ld->label, c, sizeof(ld->label));
  //  cout << ld->label << " " << sd->is_more_than_two_labels_observed << " " << sd->first_observed_label <<  endl;
  c += sizeof(ld->label);
  memcpy(&ld->weight, c, sizeof(ld->weight));
  c += sizeof(ld->weight);
  memcpy(&ld->initial, c, sizeof(ld->initial));
  c += sizeof(ld->initial);

  count_label(sd, ld->label);
  return c;
}